

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.cpp
# Opt level: O2

void clearvalues(global_State *g,GCObject *l,GCObject *f)

{
  byte bVar1;
  Node *pNVar2;
  TValue *pTVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  Node *n;
  Table *h;
  
  for (; l != f; l = (l->h).gclist) {
    bVar1 = (l->h).lsizenode;
    pNVar2 = (l->h).node;
    lVar6 = 0;
    for (lVar5 = 0; lVar5 < (l->h).sizearray; lVar5 = lVar5 + 1) {
      pTVar3 = (l->h).array;
      iVar4 = iscleared(g,(TValue *)((long)&pTVar3->value_ + lVar6));
      if (iVar4 != 0) {
        *(undefined4 *)((long)&pTVar3->tt_ + lVar6) = 0;
      }
      lVar6 = lVar6 + 0x10;
    }
    for (n = (l->h).node; n < pNVar2 + (1 << (bVar1 & 0x1f)); n = n + 1) {
      if ((n->i_val).tt_ != 0) {
        iVar4 = iscleared(g,&n->i_val);
        if (iVar4 != 0) {
          (n->i_val).tt_ = 0;
          removeentry(n);
        }
      }
    }
  }
  return;
}

Assistant:

static void clearvalues (global_State *g, GCObject *l, GCObject *f) {
  for (; l != f; l = gco2t(l)->gclist) {
    Table *h = gco2t(l);
    Node *n, *limit = gnodelast(h);
    int i;
    for (i = 0; i < h->sizearray; i++) {
      TValue *o = &h->array[i];
      if (iscleared(g, o))  /* value was collected? */
        setnilvalue(o);  /* remove value */
    }
    for (n = gnode(h, 0); n < limit; n++) {
      if (!ttisnil(gval(n)) && iscleared(g, gval(n))) {
        setnilvalue(gval(n));  /* remove value ... */
        removeentry(n);  /* and remove entry from table */
      }
    }
  }
}